

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool __thiscall crnlib::command_line_params::is_param(command_line_params *this,uint index)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  dynamic_string *this_00;
  undefined1 local_39;
  dynamic_string *w;
  uint index_local;
  command_line_params *this_local;
  
  uVar3 = vector<crnlib::dynamic_string>::size(&this->m_params);
  if (index < uVar3) {
    this_00 = vector<crnlib::dynamic_string>::operator[](&this->m_params,index);
    bVar1 = dynamic_string::is_empty(this_00);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      uVar3 = dynamic_string::get_len(this_00);
      local_39 = false;
      if (1 < uVar3) {
        cVar2 = dynamic_string::operator[](this_00,0);
        local_39 = cVar2 == '-';
      }
      this_local._7_1_ = local_39;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool command_line_params::is_param(uint index) const
    {
        CRNLIB_ASSERT(index < m_params.size());
        if (index >= m_params.size())
        {
            return false;
        }

        const dynamic_string& w = m_params[index];
        if (w.is_empty())
        {
            return false;
        }

#if CRNLIB_CMD_LINE_ALLOW_SLASH_PARAMS
        return (w.get_len() >= 2) && ((w[0] == '-') || (w[0] == '/'));
#else
        return (w.get_len() >= 2) && (w[0] == '-');
#endif
    }